

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SystemIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SystemIdentifier *this)

{
  undefined2 uVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString KStack_208;
  KString local_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"System Identifier:");
  poVar2 = std::operator<<(poVar2,"\n\tType:           ");
  ENUMS::GetEnumAsStringSystemType_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)this->m_ui16SystemType,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2,"\n\tName:           ");
  ENUMS::GetEnumAsStringSystemName_abi_cxx11_
            (&local_1e8,(ENUMS *)(ulong)this->m_ui16SystemName,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2,"\n\tMode:           ");
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_
            (&KStack_208,(ENUMS *)(ulong)this->m_ui8SystemMode,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&KStack_208);
  poVar2 = std::operator<<(poVar2,"\n\tChange/Options: ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&KStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  uVar1 = this->m_ui16SystemType;
  if ((ushort)(uVar1 - 1) < 2) {
    poVar2 = std::operator<<(local_198,"\tAlt Mode 4: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8ChangeOptions >> 1 & 1)
    ;
    poVar2 = std::operator<<(poVar2,"\n\tAlt Mode C:  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8ChangeOptions >> 2 & 1)
    ;
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString SystemIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "System Identifier:"
       << "\n\tType:           " << GetEnumAsStringSystemType( m_ui16SystemType )
       << "\n\tName:           " << GetEnumAsStringSystemName( m_ui16SystemName )
       << "\n\tMode:           " << GetEnumAsStringSystemMode( m_ui8SystemMode )
       << "\n\tChange/Options: " << ( KBOOL )m_ui8ChangeIndicator
       << "\n";

    if( m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Interrogator ||
            m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Transponder )
    {
        ss << "\tAlt Mode 4: " << ( KUINT16 )m_ui8AltMode4
           << "\n\tAlt Mode C:  " << ( KUINT16 )m_ui8AltModeC
           << "\n";
    }

    return ss.str();
}